

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O3

bool tinyusdz::prim::ReconstructPrim<tinyusdz::Skeleton>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,Skeleton *skel,
               string *warn,string *err,PrimReconstructOptions *options)

{
  _Rb_tree_header *p_Var1;
  uint uVar2;
  _Base_ptr p_Var3;
  bool bVar4;
  int iVar5;
  ostream *poVar6;
  long *plVar7;
  const_iterator cVar8;
  mapped_type *this;
  _Base_ptr p_Var9;
  Property *pPVar10;
  size_type *psVar11;
  char *pcVar12;
  char *pcVar13;
  bool bVar14;
  ParseResult ret;
  Attribute *attr;
  ostringstream ss_e;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  TypedAttribute<std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>_>
  *in_stack_fffffffffffffc58;
  TypedAttribute<std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>_>
  *pTVar15;
  string local_398;
  TypedAttribute<std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>_>
  *local_378;
  undefined1 local_370 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_358;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  Property *local_328;
  string *local_320;
  TypedAttributeWithFallback<tinyusdz::Purpose> *local_318;
  TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::Visibility>_> *local_310;
  _Base_ptr local_308;
  undefined1 local_300 [16];
  code *local_2f0;
  code *pcStack_2e8;
  ios_base local_290 [280];
  string *local_178;
  storage_t<tinyusdz::Token> local_170;
  _Base_ptr local_150;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_148;
  string local_118;
  string local_f8 [16];
  undefined1 local_e8 [32];
  long local_c8 [2];
  string local_b8 [16];
  undefined8 local_a8 [2];
  _Base_ptr *local_98 [2];
  _Base_ptr local_88 [2];
  _Any_data local_78;
  pointer local_68;
  pointer pSStack_60;
  _Any_data local_58;
  _Alloc_hider local_48;
  code *pcStack_40;
  
  local_148._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_148._M_impl.super__Rb_tree_header._M_header;
  local_148._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  bVar14 = false;
  local_148._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_148._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_148._M_impl.super__Rb_tree_header._M_header._M_right =
       local_148._M_impl.super__Rb_tree_header._M_header._M_left;
  bVar4 = ReconstructXformOpsFromProperties
                    (spec,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&local_148,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                      *)properties,
                     (vector<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_> *)skel,err);
  if (bVar4) {
    p_Var9 = (properties->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    local_150 = &(properties->_M_t)._M_impl.super__Rb_tree_header._M_header;
    bVar14 = true;
    if (p_Var9 != local_150) {
      local_170._8_8_ = &skel->animationSource;
      local_170._24_8_ = &skel->bindTransforms;
      local_170._16_8_ = &skel->joints;
      local_170.data._0_8_ = (undefined8)&skel->jointNames;
      local_178 = (string *)&skel->restTransforms;
      local_290._272_8_ = &skel->extent;
      local_290._264_8_ = &skel->props;
      local_318 = &skel->purpose;
      local_310 = &skel->visibility;
      local_378 = (TypedAttribute<std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>_>
                   *)err;
      local_320 = warn;
      do {
        iVar5 = ::std::__cxx11::string::compare((char *)(p_Var9 + 1));
        if (iVar5 == 0) {
          if ((((ulong)p_Var9[0x17]._M_parent & 0xfffffffe00000000) == 0x200000000) &&
             (*(int *)&p_Var9[0x17]._M_left == 1)) {
            nonstd::optional_lite::optional<tinyusdz::Relationship>::operator=
                      ((optional<tinyusdz::Relationship> *)local_170._8_8_,
                       (Relationship *)&p_Var9[0x17]._M_left);
            local_300._0_8_ = &local_2f0;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_300,"skel:animationSource","");
            ::std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&local_148,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_300);
            if ((code **)local_300._0_8_ != &local_2f0) {
              operator_delete((void *)local_300._0_8_,(ulong)((long)local_2f0 + 1));
            }
            goto LAB_001ed323;
          }
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_300);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_300,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_300,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                     ,0x5a);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_300,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_300,"ReconstructPrim",0xf);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_300,"():",3);
          poVar6 = (ostream *)::std::ostream::operator<<((ostringstream *)local_300,0xb67);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_300,"`",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_300,"skel:animationSource",0x14);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_300,"` must be a Relationship with Path target.",0x2a);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_300,"\n",1);
          pTVar15 = local_378;
          if (local_378 !=
              (TypedAttribute<std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>_>
               *)0x0) {
            ::std::__cxx11::stringbuf::str();
            plVar7 = (long *)::std::__cxx11::string::_M_append
                                       ((char *)&local_398,(ulong)(pTVar15->_metas).interpolation);
            psVar11 = (size_type *)(plVar7 + 2);
            if ((size_type *)*plVar7 == psVar11) {
              local_370._16_8_ = *psVar11;
              aStack_358._M_allocated_capacity = plVar7[3];
              local_370._0_8_ = local_370 + 0x10;
            }
            else {
              local_370._16_8_ = *psVar11;
              local_370._0_8_ = (size_type *)*plVar7;
            }
            local_370._8_8_ = plVar7[1];
            *plVar7 = (long)psVar11;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            ::std::__cxx11::string::operator=((string *)pTVar15,(string *)local_370);
            if ((undefined1 *)local_370._0_8_ != local_370 + 0x10) {
LAB_001eedf3:
              operator_delete((void *)local_370._0_8_,local_370._16_8_ + 1);
            }
LAB_001eee00:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_398._M_dataplus._M_p != &local_398.field_2) {
              operator_delete(local_398._M_dataplus._M_p,local_398.field_2._M_allocated_capacity + 1
                             );
            }
          }
LAB_001eee1c:
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_300);
          ::std::ios_base::~ios_base(local_290);
LAB_001eee3d:
          bVar14 = false;
          goto LAB_001eee40;
        }
LAB_001ed323:
        local_98[0] = local_88;
        local_308 = p_Var9 + 1;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)local_98,*(long *)(p_Var9 + 1),
                   (long)&(p_Var9[1]._M_parent)->_M_color + *(long *)(p_Var9 + 1));
        pPVar10 = (Property *)local_300;
        local_300._0_8_ = &local_2f0;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)pPVar10,"bindTransforms","");
        local_328 = (Property *)(p_Var9 + 2);
        (anonymous_namespace)::
        ParseTypedAttribute<std::vector<tinyusdz::value::matrix4d,std::allocator<tinyusdz::value::matrix4d>>>
                  ((ParseResult *)local_370,(_anonymous_namespace_ *)&local_148,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_98,(string *)(p_Var9 + 2),pPVar10,(string *)local_170._24_8_,
                   in_stack_fffffffffffffc58);
        if ((code **)local_300._0_8_ != &local_2f0) {
          operator_delete((void *)local_300._0_8_,(ulong)((long)local_2f0 + 1));
        }
        if (local_98[0] != local_88) {
          operator_delete(local_98[0],(ulong)((long)&local_88[0]->_M_color + 1));
        }
        iVar5 = 0;
        if ((local_370._0_8_ & 0xfffffffd) == 0) {
          iVar5 = 3;
LAB_001ed638:
          bVar4 = false;
        }
        else {
          bVar4 = true;
          if (local_370._0_4_ != Unmatched) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_300);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_300,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_300,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_300,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_300,"ReconstructPrim",0xf);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_300,"():",3);
            poVar6 = (ostream *)::std::ostream::operator<<((ostringstream *)local_300,0xb6d);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
            local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_348,"Parsing attribute `{}` failed. Error: {}","");
            fmt::format<char[15],std::__cxx11::string>
                      (&local_398,(fmt *)&local_348,(string *)"bindTransforms",
                       (char (*) [15])(local_370 + 8),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar10)
            ;
            poVar6 = ::std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_300,local_398._M_dataplus._M_p,
                                local_398._M_string_length);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_398._M_dataplus._M_p != &local_398.field_2) {
              operator_delete(local_398._M_dataplus._M_p,local_398.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_348._M_dataplus._M_p != &local_348.field_2) {
              operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_378 !=
                (TypedAttribute<std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>_>
                 *)0x0) {
              ::std::__cxx11::stringbuf::str();
              plVar7 = (long *)::std::__cxx11::string::_M_append
                                         ((char *)&local_348,
                                          (ulong)(local_378->_metas).interpolation);
              psVar11 = (size_type *)(plVar7 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar7 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar11) {
                local_398.field_2._M_allocated_capacity = *psVar11;
                local_398.field_2._8_8_ = plVar7[3];
                local_398._M_dataplus._M_p = (pointer)&local_398.field_2;
              }
              else {
                local_398.field_2._M_allocated_capacity = *psVar11;
                local_398._M_dataplus._M_p = (pointer)*plVar7;
              }
              local_398._M_string_length = plVar7[1];
              *plVar7 = (long)psVar11;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              ::std::__cxx11::string::operator=((string *)local_378,(string *)&local_398);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_398._M_dataplus._M_p != &local_398.field_2) {
                operator_delete(local_398._M_dataplus._M_p,
                                local_398.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_348._M_dataplus._M_p != &local_348.field_2) {
                operator_delete(local_348._M_dataplus._M_p,
                                local_348.field_2._M_allocated_capacity + 1);
              }
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_300);
            ::std::ios_base::~ios_base(local_290);
            iVar5 = 1;
            goto LAB_001ed638;
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_370._8_8_ != &aStack_358) {
          operator_delete((void *)local_370._8_8_,aStack_358._M_allocated_capacity + 1);
        }
        if (bVar4) {
          local_b8._0_8_ = local_a8;
          ::std::__cxx11::string::_M_construct<char*>
                    (local_b8,*(long *)(p_Var9 + 1),
                     (long)&(p_Var9[1]._M_parent)->_M_color + *(long *)(p_Var9 + 1));
          pPVar10 = (Property *)local_300;
          local_300._0_8_ = &local_2f0;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)pPVar10,"joints","");
          (anonymous_namespace)::
          ParseTypedAttribute<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>>
                    ((ParseResult *)local_370,(_anonymous_namespace_ *)&local_148,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_b8,(string *)local_328,pPVar10,(string *)local_170._16_8_,
                     (TypedAttribute<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>
                      *)in_stack_fffffffffffffc58);
          if ((code **)local_300._0_8_ != &local_2f0) {
            operator_delete((void *)local_300._0_8_,(ulong)((long)local_2f0 + 1));
          }
          if ((undefined8 *)local_b8._0_8_ != local_a8) {
            operator_delete((void *)local_b8._0_8_,local_a8[0] + 1);
          }
          iVar5 = 0;
          if ((local_370._0_8_ & 0xfffffffd) == 0) {
            iVar5 = 3;
LAB_001ed95e:
            bVar4 = false;
          }
          else {
            bVar4 = true;
            if (local_370._0_4_ != Unmatched) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_300);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_300,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_300,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_300,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_300,"ReconstructPrim",0xf);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_300,"():",3);
              poVar6 = (ostream *)::std::ostream::operator<<((ostringstream *)local_300,0xb6e);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
              local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_348,"Parsing attribute `{}` failed. Error: {}","");
              fmt::format<char[7],std::__cxx11::string>
                        (&local_398,(fmt *)&local_348,(string *)"joints",
                         (char (*) [7])(local_370 + 8),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         pPVar10);
              poVar6 = ::std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_300,local_398._M_dataplus._M_p,
                                  local_398._M_string_length);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_398._M_dataplus._M_p != &local_398.field_2) {
                operator_delete(local_398._M_dataplus._M_p,
                                local_398.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_348._M_dataplus._M_p != &local_348.field_2) {
                operator_delete(local_348._M_dataplus._M_p,
                                local_348.field_2._M_allocated_capacity + 1);
              }
              if (local_378 !=
                  (TypedAttribute<std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>_>
                   *)0x0) {
                ::std::__cxx11::stringbuf::str();
                plVar7 = (long *)::std::__cxx11::string::_M_append
                                           ((char *)&local_348,
                                            (ulong)(local_378->_metas).interpolation);
                psVar11 = (size_type *)(plVar7 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar7 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar11) {
                  local_398.field_2._M_allocated_capacity = *psVar11;
                  local_398.field_2._8_8_ = plVar7[3];
                  local_398._M_dataplus._M_p = (pointer)&local_398.field_2;
                }
                else {
                  local_398.field_2._M_allocated_capacity = *psVar11;
                  local_398._M_dataplus._M_p = (pointer)*plVar7;
                }
                local_398._M_string_length = plVar7[1];
                *plVar7 = (long)psVar11;
                plVar7[1] = 0;
                *(undefined1 *)(plVar7 + 2) = 0;
                ::std::__cxx11::string::operator=((string *)local_378,(string *)&local_398);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_398._M_dataplus._M_p != &local_398.field_2) {
                  operator_delete(local_398._M_dataplus._M_p,
                                  local_398.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_348._M_dataplus._M_p != &local_348.field_2) {
                  operator_delete(local_348._M_dataplus._M_p,
                                  local_348.field_2._M_allocated_capacity + 1);
                }
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_300);
              ::std::ios_base::~ios_base(local_290);
              iVar5 = 1;
              goto LAB_001ed95e;
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_370._8_8_ != &aStack_358) {
            operator_delete((void *)local_370._8_8_,aStack_358._M_allocated_capacity + 1);
          }
          if (!bVar4) goto LAB_001eec50;
          local_e8._16_8_ = local_c8;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)(local_e8 + 0x10),*(long *)(p_Var9 + 1),
                     (long)&(p_Var9[1]._M_parent)->_M_color + *(long *)(p_Var9 + 1));
          pPVar10 = (Property *)local_300;
          local_300._0_8_ = &local_2f0;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)pPVar10,"jointNames","");
          (anonymous_namespace)::
          ParseTypedAttribute<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>>
                    ((ParseResult *)local_370,(_anonymous_namespace_ *)&local_148,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)(local_e8 + 0x10),(string *)local_328,pPVar10,(string *)local_170.data._0_8_
                     ,(TypedAttribute<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>
                       *)in_stack_fffffffffffffc58);
          if ((code **)local_300._0_8_ != &local_2f0) {
            operator_delete((void *)local_300._0_8_,(ulong)((long)local_2f0 + 1));
          }
          if ((long *)local_e8._16_8_ != local_c8) {
            operator_delete((void *)local_e8._16_8_,local_c8[0] + 1);
          }
          iVar5 = 0;
          if ((local_370._0_8_ & 0xfffffffd) == 0) {
            iVar5 = 3;
LAB_001edc84:
            bVar4 = false;
          }
          else {
            bVar4 = true;
            if (local_370._0_4_ != Unmatched) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_300);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_300,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_300,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_300,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_300,"ReconstructPrim",0xf);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_300,"():",3);
              poVar6 = (ostream *)::std::ostream::operator<<((ostringstream *)local_300,0xb6f);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
              local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_348,"Parsing attribute `{}` failed. Error: {}","");
              fmt::format<char[11],std::__cxx11::string>
                        (&local_398,(fmt *)&local_348,(string *)"jointNames",
                         (char (*) [11])(local_370 + 8),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         pPVar10);
              poVar6 = ::std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_300,local_398._M_dataplus._M_p,
                                  local_398._M_string_length);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_398._M_dataplus._M_p != &local_398.field_2) {
                operator_delete(local_398._M_dataplus._M_p,
                                local_398.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_348._M_dataplus._M_p != &local_348.field_2) {
                operator_delete(local_348._M_dataplus._M_p,
                                local_348.field_2._M_allocated_capacity + 1);
              }
              if (local_378 !=
                  (TypedAttribute<std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>_>
                   *)0x0) {
                ::std::__cxx11::stringbuf::str();
                plVar7 = (long *)::std::__cxx11::string::_M_append
                                           ((char *)&local_348,
                                            (ulong)(local_378->_metas).interpolation);
                psVar11 = (size_type *)(plVar7 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar7 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar11) {
                  local_398.field_2._M_allocated_capacity = *psVar11;
                  local_398.field_2._8_8_ = plVar7[3];
                  local_398._M_dataplus._M_p = (pointer)&local_398.field_2;
                }
                else {
                  local_398.field_2._M_allocated_capacity = *psVar11;
                  local_398._M_dataplus._M_p = (pointer)*plVar7;
                }
                local_398._M_string_length = plVar7[1];
                *plVar7 = (long)psVar11;
                plVar7[1] = 0;
                *(undefined1 *)(plVar7 + 2) = 0;
                ::std::__cxx11::string::operator=((string *)local_378,(string *)&local_398);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_398._M_dataplus._M_p != &local_398.field_2) {
                  operator_delete(local_398._M_dataplus._M_p,
                                  local_398.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_348._M_dataplus._M_p != &local_348.field_2) {
                  operator_delete(local_348._M_dataplus._M_p,
                                  local_348.field_2._M_allocated_capacity + 1);
                }
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_300);
              ::std::ios_base::~ios_base(local_290);
              iVar5 = 1;
              goto LAB_001edc84;
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_370._8_8_ != &aStack_358) {
            operator_delete((void *)local_370._8_8_,aStack_358._M_allocated_capacity + 1);
          }
          if (!bVar4) goto LAB_001eec50;
          local_f8._0_8_ = local_e8;
          ::std::__cxx11::string::_M_construct<char*>
                    (local_f8,*(long *)(p_Var9 + 1),
                     (long)&(p_Var9[1]._M_parent)->_M_color + *(long *)(p_Var9 + 1));
          pPVar10 = (Property *)local_300;
          local_300._0_8_ = &local_2f0;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)pPVar10,"restTransforms","");
          (anonymous_namespace)::
          ParseTypedAttribute<std::vector<tinyusdz::value::matrix4d,std::allocator<tinyusdz::value::matrix4d>>>
                    ((ParseResult *)local_370,(_anonymous_namespace_ *)&local_148,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_f8,(string *)local_328,pPVar10,local_178,in_stack_fffffffffffffc58);
          if ((code **)local_300._0_8_ != &local_2f0) {
            operator_delete((void *)local_300._0_8_,(ulong)((long)local_2f0 + 1));
          }
          if ((undefined1 *)local_f8._0_8_ != local_e8) {
            operator_delete((void *)local_f8._0_8_,local_e8._0_8_ + 1);
          }
          iVar5 = 0;
          if ((local_370._0_8_ & 0xfffffffd) == 0) {
            iVar5 = 3;
LAB_001edfad:
            bVar4 = false;
          }
          else {
            bVar4 = true;
            if (local_370._0_4_ != Unmatched) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_300);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_300,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_300,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_300,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_300,"ReconstructPrim",0xf);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_300,"():",3);
              poVar6 = (ostream *)::std::ostream::operator<<((ostringstream *)local_300,0xb70);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
              local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_348,"Parsing attribute `{}` failed. Error: {}","");
              fmt::format<char[15],std::__cxx11::string>
                        (&local_398,(fmt *)&local_348,(string *)"restTransforms",
                         (char (*) [15])(local_370 + 8),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         pPVar10);
              poVar6 = ::std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_300,local_398._M_dataplus._M_p,
                                  local_398._M_string_length);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_398._M_dataplus._M_p != &local_398.field_2) {
                operator_delete(local_398._M_dataplus._M_p,
                                local_398.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_348._M_dataplus._M_p != &local_348.field_2) {
                operator_delete(local_348._M_dataplus._M_p,
                                local_348.field_2._M_allocated_capacity + 1);
              }
              if (local_378 !=
                  (TypedAttribute<std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>_>
                   *)0x0) {
                ::std::__cxx11::stringbuf::str();
                plVar7 = (long *)::std::__cxx11::string::_M_append
                                           ((char *)&local_348,
                                            (ulong)(local_378->_metas).interpolation);
                psVar11 = (size_type *)(plVar7 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar7 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar11) {
                  local_398.field_2._M_allocated_capacity = *psVar11;
                  local_398.field_2._8_8_ = plVar7[3];
                  local_398._M_dataplus._M_p = (pointer)&local_398.field_2;
                }
                else {
                  local_398.field_2._M_allocated_capacity = *psVar11;
                  local_398._M_dataplus._M_p = (pointer)*plVar7;
                }
                local_398._M_string_length = plVar7[1];
                *plVar7 = (long)psVar11;
                plVar7[1] = 0;
                *(undefined1 *)(plVar7 + 2) = 0;
                ::std::__cxx11::string::operator=((string *)local_378,(string *)&local_398);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_398._M_dataplus._M_p != &local_398.field_2) {
                  operator_delete(local_398._M_dataplus._M_p,
                                  local_398.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_348._M_dataplus._M_p != &local_348.field_2) {
                  operator_delete(local_348._M_dataplus._M_p,
                                  local_348.field_2._M_allocated_capacity + 1);
                }
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_300);
              ::std::ios_base::~ios_base(local_290);
              iVar5 = 1;
              goto LAB_001edfad;
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_370._8_8_ != &aStack_358) {
            operator_delete((void *)local_370._8_8_,aStack_358._M_allocated_capacity + 1);
          }
          p_Var3 = local_308;
          if (!bVar4) goto LAB_001eec50;
          iVar5 = ::std::__cxx11::string::compare((char *)local_308);
          if (iVar5 == 0) {
            local_300._0_8_ = &local_2f0;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)local_300,"visibility","");
            cVar8 = ::std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::find(&local_148,(key_type *)local_300);
            if ((code **)local_300._0_8_ != &local_2f0) {
              operator_delete((void *)local_300._0_8_,(ulong)((long)local_2f0 + 1));
            }
            pTVar15 = local_378;
            if ((_Rb_tree_header *)cVar8._M_node == &local_148._M_impl.super__Rb_tree_header) {
              if (((ulong)p_Var9[0x17]._M_parent & 0xfffffffe00000000) != 0x200000000) {
                Attribute::type_name_abi_cxx11_((string *)local_300,&local_328->_attrib);
                local_370._0_8_ = local_370 + 0x10;
                local_370._8_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x5;
                local_370._16_6_ = 0x6e656b6f74;
                if (((local_300._8_8_ == 5) &&
                    ((char)*(int *)(local_300._0_8_ + 4) == 'n' &&
                     *(int *)local_300._0_8_ == 0x656b6f74)) &&
                   (uVar2 = *(uint *)((long)&p_Var9[0x17]._M_parent + 4), uVar2 < 2)) {
                  if ((code **)local_300._0_8_ != &local_2f0) {
                    operator_delete((void *)local_300._0_8_,(ulong)((long)local_2f0 + 1));
                  }
                  if (uVar2 == 0) {
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_300);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_300,"[warn]",6);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_300,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                               ,0x5a);
                    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_300,":",1)
                    ;
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_300,"ReconstructPrim",0xf);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_300,"():",3);
                    poVar6 = (ostream *)::std::ostream::operator<<((ostringstream *)local_300,0xb72)
                    ;
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_300,"No value assigned to `",0x16);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_300,"visibility",10);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_300,"` token attribute. Set default token value.",
                               0x2b);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_300,"\n",1);
                    if (local_320 != (string *)0x0) {
                      ::std::__cxx11::stringbuf::str();
                      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_370,&local_398,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)pTVar15);
                      ::std::__cxx11::string::operator=((string *)local_320,(string *)local_370);
                      if ((undefined1 *)local_370._0_8_ != local_370 + 0x10) {
                        operator_delete((void *)local_370._0_8_,local_370._16_8_ + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_398._M_dataplus._M_p != &local_398.field_2) {
                        operator_delete(local_398._M_dataplus._M_p,
                                        local_398.field_2._M_allocated_capacity + 1);
                      }
                    }
                    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_300);
                    ::std::ios_base::~ios_base(local_290);
                    AttrMetas::operator=(&local_310->_metas,(AttrMetas *)(p_Var9 + 7));
                    pcVar13 = "visibility";
                    pcVar12 = "";
LAB_001ee857:
                    local_300._0_8_ = &local_2f0;
                    ::std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_300,pcVar13,pcVar12);
                    ::std::
                    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    ::_M_insert_unique<std::__cxx11::string>
                              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                *)&local_148,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_300);
                    if ((code **)local_300._0_8_ != &local_2f0) {
                      operator_delete((void *)local_300._0_8_,(ulong)((long)local_2f0 + 1));
                    }
                    goto LAB_001eec5d;
                  }
                }
                else if ((code **)local_300._0_8_ != &local_2f0) {
                  operator_delete((void *)local_300._0_8_,(ulong)((long)local_2f0 + 1));
                }
              }
              local_300._8_8_ = 0;
              local_300._0_8_ = VisibilityEnumHandler;
              pcStack_2e8 = ::std::
                            _Function_handler<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                            ::_M_invoke;
              local_2f0 = ::std::
                          _Function_handler<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                          ::_M_manager;
              local_370._0_8_ = local_370 + 0x10;
              ::std::__cxx11::string::_M_construct<char_const*>((string *)local_370,"visibility","")
              ;
              bVar4 = options->strict_allowedToken_check;
              local_48._M_p = (pointer)0x0;
              pcStack_40 = (code *)0x0;
              local_58._M_unused._M_object = (void *)0x0;
              local_58._8_8_ = 0;
              if (local_2f0 != (code *)0x0) {
                (*local_2f0)(&local_58,local_300,2);
                local_48._M_p = (pointer)local_2f0;
                pcStack_40 = pcStack_2e8;
              }
              bVar4 = ParseTimeSampledEnumProperty<tinyusdz::Visibility,tinyusdz::Visibility>
                                ((string *)local_370,bVar4,
                                 (EnumHandlerFun<tinyusdz::Visibility> *)&local_58,
                                 &local_328->_attrib,local_310,local_320,(string *)pTVar15);
              if ((code *)local_48._M_p != (code *)0x0) {
                (*(code *)local_48._M_p)(&local_58,&local_58,3);
              }
              if ((undefined1 *)local_370._0_8_ != local_370 + 0x10) {
                operator_delete((void *)local_370._0_8_,local_370._16_8_ + 1);
              }
              iVar5 = 1;
              if (bVar4) {
                AttrMetas::operator=(&local_310->_metas,(AttrMetas *)(p_Var9 + 7));
                pcVar13 = "visibility";
                pcVar12 = "";
LAB_001eec05:
                local_370._0_8_ = local_370 + 0x10;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_370,pcVar13,pcVar12);
                ::std::
                _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                ::_M_insert_unique<std::__cxx11::string>
                          ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                            *)&local_148,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_370);
                if ((undefined1 *)local_370._0_8_ != local_370 + 0x10) {
                  operator_delete((void *)local_370._0_8_,local_370._16_8_ + 1);
                }
                iVar5 = 3;
              }
LAB_001eec31:
              in_stack_fffffffffffffc58 = pTVar15;
              if (local_2f0 != (code *)0x0) {
                (*local_2f0)(local_300,local_300,3);
                in_stack_fffffffffffffc58 = pTVar15;
              }
              goto LAB_001eec50;
            }
          }
          else {
            iVar5 = ::std::__cxx11::string::compare((char *)p_Var3);
            if (iVar5 == 0) {
              local_300._0_8_ = &local_2f0;
              ::std::__cxx11::string::_M_construct<char_const*>((string *)local_300,"purpose","");
              cVar8 = ::std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::find(&local_148,(key_type *)local_300);
              if ((code **)local_300._0_8_ != &local_2f0) {
                operator_delete((void *)local_300._0_8_,(ulong)((long)local_2f0 + 1));
              }
              pTVar15 = local_378;
              if ((_Rb_tree_header *)cVar8._M_node == &local_148._M_impl.super__Rb_tree_header) {
                if (((ulong)p_Var9[0x17]._M_parent & 0xfffffffe00000000) != 0x200000000) {
                  Attribute::type_name_abi_cxx11_((string *)local_300,&local_328->_attrib);
                  local_370._0_8_ = local_370 + 0x10;
                  local_370._8_8_ =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x5;
                  local_370._16_6_ = 0x6e656b6f74;
                  if (((local_300._8_8_ == 5) &&
                      ((char)*(int *)(local_300._0_8_ + 4) == 'n' &&
                       *(int *)local_300._0_8_ == 0x656b6f74)) &&
                     (uVar2 = *(uint *)((long)&p_Var9[0x17]._M_parent + 4), uVar2 < 2)) {
                    if ((code **)local_300._0_8_ != &local_2f0) {
                      operator_delete((void *)local_300._0_8_,(ulong)((long)local_2f0 + 1));
                    }
                    if (uVar2 == 0) {
                      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_300);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_300,"[warn]",6);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_300,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                 ,0x5a);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_300,":",1);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_300,"ReconstructPrim",0xf);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_300,"():",3);
                      poVar6 = (ostream *)
                               ::std::ostream::operator<<((ostringstream *)local_300,0xb74);
                      ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_300,"No value assigned to `",0x16);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_300,"purpose",7);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_300,"` token attribute. Set default token value.",
                                 0x2b);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_300,"\n",1);
                      if (local_320 != (string *)0x0) {
                        ::std::__cxx11::stringbuf::str();
                        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_370,&local_398,
                                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)pTVar15);
                        ::std::__cxx11::string::operator=((string *)local_320,(string *)local_370);
                        if ((undefined1 *)local_370._0_8_ != local_370 + 0x10) {
                          operator_delete((void *)local_370._0_8_,local_370._16_8_ + 1);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_398._M_dataplus._M_p != &local_398.field_2) {
                          operator_delete(local_398._M_dataplus._M_p,
                                          local_398.field_2._M_allocated_capacity + 1);
                        }
                      }
                      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_300);
                      ::std::ios_base::~ios_base(local_290);
                      AttrMetas::operator=(&local_318->_metas,(AttrMetas *)(p_Var9 + 7));
                      pcVar13 = "purpose";
                      pcVar12 = "";
                      goto LAB_001ee857;
                    }
                  }
                  else if ((code **)local_300._0_8_ != &local_2f0) {
                    operator_delete((void *)local_300._0_8_,(ulong)((long)local_2f0 + 1));
                  }
                }
                local_300._8_8_ = 0;
                local_300._0_8_ = PurposeEnumHandler;
                pcStack_2e8 = ::std::
                              _Function_handler<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                              ::_M_invoke;
                local_2f0 = ::std::
                            _Function_handler<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                            ::_M_manager;
                local_370._0_8_ = local_370 + 0x10;
                ::std::__cxx11::string::_M_construct<char_const*>((string *)local_370,"purpose","");
                bVar4 = options->strict_allowedToken_check;
                local_68 = (pointer)0x0;
                pSStack_60 = (pointer)0x0;
                local_78._M_unused._M_object = (void *)0x0;
                local_78._8_8_ = (pointer)0x0;
                if (local_2f0 != (code *)0x0) {
                  (*local_2f0)(&local_78,local_300,2);
                  local_68 = (pointer)local_2f0;
                  pSStack_60 = (pointer)pcStack_2e8;
                }
                bVar4 = ParseUniformEnumProperty<tinyusdz::Purpose,tinyusdz::Purpose>
                                  ((string *)local_370,bVar4,
                                   (EnumHandlerFun<tinyusdz::Purpose> *)&local_78,
                                   &local_328->_attrib,local_318,local_320,(string *)pTVar15);
                if (local_68 != (pointer)0x0) {
                  (*(code *)local_68)(&local_78,&local_78,3);
                }
                if ((undefined1 *)local_370._0_8_ != local_370 + 0x10) {
                  operator_delete((void *)local_370._0_8_,local_370._16_8_ + 1);
                }
                iVar5 = 1;
                if (bVar4) {
                  AttrMetas::operator=(&local_318->_metas,(AttrMetas *)(p_Var9 + 7));
                  pcVar13 = "purpose";
                  pcVar12 = "";
                  goto LAB_001eec05;
                }
                goto LAB_001eec31;
              }
            }
            else {
              local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_118,*(long *)(p_Var9 + 1),
                         (long)&(p_Var9[1]._M_parent)->_M_color + *(long *)(p_Var9 + 1));
              local_300._0_8_ = &local_2f0;
              ::std::__cxx11::string::_M_construct<char_const*>((string *)local_300,"extent","");
              pPVar10 = local_328;
              anon_unknown_0::ParseExtentAttribute
                        ((ParseResult *)local_370,
                         (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&local_148,&local_118,local_328,(string *)local_300,
                         (TypedAttribute<tinyusdz::Animatable<tinyusdz::Extent>_> *)
                         local_290._272_8_);
              if ((code **)local_300._0_8_ != &local_2f0) {
                operator_delete((void *)local_300._0_8_,(ulong)((long)local_2f0 + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_118._M_dataplus._M_p != &local_118.field_2) {
                operator_delete(local_118._M_dataplus._M_p,
                                local_118.field_2._M_allocated_capacity + 1);
              }
              iVar5 = 0;
              if ((local_370._0_8_ & 0xfffffffd) == 0) {
                iVar5 = 3;
LAB_001ee892:
                bVar4 = false;
              }
              else {
                bVar4 = true;
                if (local_370._0_4_ != Unmatched) {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_300);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_300,"[error]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_300,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                             ,0x5a);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_300,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_300,"ReconstructPrim",0xf);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_300,"():",3)
                  ;
                  poVar6 = (ostream *)::std::ostream::operator<<((ostringstream *)local_300,0xb75);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
                  local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
                  ::std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_348,"Parsing attribute `extent` failed. Error: {}","")
                  ;
                  fmt::format<std::__cxx11::string>
                            ((string *)&local_398,(fmt *)&local_348,(string *)(local_370 + 8),
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             pPVar10);
                  poVar6 = ::std::__ostream_insert<char,std::char_traits<char>>
                                     ((ostream *)local_300,local_398._M_dataplus._M_p,
                                      local_398._M_string_length);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_398._M_dataplus._M_p != &local_398.field_2) {
                    operator_delete(local_398._M_dataplus._M_p,
                                    local_398.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_348._M_dataplus._M_p != &local_348.field_2) {
                    operator_delete(local_348._M_dataplus._M_p,
                                    local_348.field_2._M_allocated_capacity + 1);
                  }
                  if (local_378 !=
                      (TypedAttribute<std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>_>
                       *)0x0) {
                    ::std::__cxx11::stringbuf::str();
                    pTVar15 = local_378;
                    ::std::operator+(&local_398,&local_348,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_378);
                    ::std::__cxx11::string::operator=((string *)pTVar15,(string *)&local_398);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_398._M_dataplus._M_p != &local_398.field_2) {
                      operator_delete(local_398._M_dataplus._M_p,
                                      local_398.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_348._M_dataplus._M_p != &local_348.field_2) {
                      operator_delete(local_348._M_dataplus._M_p,
                                      local_348.field_2._M_allocated_capacity + 1);
                    }
                  }
                  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_300);
                  ::std::ios_base::~ios_base(local_290);
                  iVar5 = 1;
                  goto LAB_001ee892;
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_370._8_8_ != &aStack_358) {
                operator_delete((void *)local_370._8_8_,aStack_358._M_allocated_capacity + 1);
              }
              p_Var3 = local_308;
              if (!bVar4) goto LAB_001eec50;
              cVar8 = ::std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::find(&local_148,(key_type *)local_308);
              p_Var1 = &local_148._M_impl.super__Rb_tree_header;
              if ((_Rb_tree_header *)cVar8._M_node == p_Var1) {
                this = ::std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                       ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                                     *)local_290._264_8_,(key_type *)p_Var3);
                Property::operator=(this,local_328);
                ::std::
                _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                ::_M_insert_unique<std::__cxx11::string_const&>
                          ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                            *)&local_148,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           p_Var3);
              }
              cVar8 = ::std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::find(&local_148,(key_type *)p_Var3);
              if ((_Rb_tree_header *)cVar8._M_node == p_Var1) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_300);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_300,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_300,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                           ,0x5a);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_300,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_300,"ReconstructPrim",0xf);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_300,"():",3);
                poVar6 = (ostream *)::std::ostream::operator<<((ostringstream *)local_300,0xb77);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
                ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_370,"Unsupported/unimplemented property: ",
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)p_Var3);
                poVar6 = ::std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)local_300,(char *)local_370._0_8_,local_370._8_8_);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
                if ((undefined1 *)local_370._0_8_ != local_370 + 0x10) {
                  operator_delete((void *)local_370._0_8_,local_370._16_8_ + 1);
                }
                pTVar15 = local_378;
                if (local_378 !=
                    (TypedAttribute<std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>_>
                     *)0x0) {
                  ::std::__cxx11::stringbuf::str();
                  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_370,&local_398,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)pTVar15);
                  ::std::__cxx11::string::operator=((string *)pTVar15,(string *)local_370);
                  if ((undefined1 *)local_370._0_8_ != local_370 + 0x10) goto LAB_001eedf3;
                  goto LAB_001eee00;
                }
                goto LAB_001eee1c;
              }
            }
          }
        }
        else {
LAB_001eec50:
          if ((iVar5 != 3) && (iVar5 != 0)) goto LAB_001eee3d;
        }
LAB_001eec5d:
        p_Var9 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var9);
      } while (p_Var9 != local_150);
      bVar14 = true;
    }
  }
LAB_001eee40:
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase(&local_148,(_Link_type)local_148._M_impl.super__Rb_tree_header._M_header._M_parent);
  return bVar14;
}

Assistant:

bool ReconstructPrim<Skeleton>(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    Skeleton *skel,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options) {

  (void)warn;
  (void)references;
  (void)options;

  std::set<std::string> table;
  if (!prim::ReconstructXformOpsFromProperties(spec, table, properties, &skel->xformOps, err)) {
    return false;
  }

  for (auto &prop : properties) {

    // SkelBindingAPI
    if (prop.first == kSkelAnimationSource) {

      // Must be relation of type Path.
      if (prop.second.is_relationship() && prop.second.get_relationship().is_path()) {
        {
          const Relationship &rel = prop.second.get_relationship();
          if (rel.is_path()) {
            skel->animationSource = rel;
            table.insert(kSkelAnimationSource);
          } else {
            PUSH_ERROR_AND_RETURN("`" << kSkelAnimationSource << "` target must be Path.");
          }
        }
      } else {
        PUSH_ERROR_AND_RETURN(
            "`" << kSkelAnimationSource << "` must be a Relationship with Path target.");
      }
    }

    //

    PARSE_TYPED_ATTRIBUTE(table, prop, "bindTransforms", Skeleton, skel->bindTransforms)
    PARSE_TYPED_ATTRIBUTE(table, prop, "joints", Skeleton, skel->joints)
    PARSE_TYPED_ATTRIBUTE(table, prop, "jointNames", Skeleton, skel->jointNames)
    PARSE_TYPED_ATTRIBUTE(table, prop, "restTransforms", Skeleton, skel->restTransforms)
    PARSE_TIMESAMPLED_ENUM_PROPERTY(table, prop, kVisibility, Visibility, VisibilityEnumHandler, Skeleton,
                   skel->visibility, options.strict_allowedToken_check)
    PARSE_UNIFORM_ENUM_PROPERTY(table, prop, "purpose", Purpose, PurposeEnumHandler, Skeleton,
                       skel->purpose, options.strict_allowedToken_check)
    PARSE_EXTENT_ATTRIBUTE(table, prop, "extent", Skeleton, skel->extent)
    ADD_PROPERTY(table, prop, Skeleton, skel->props)
    PARSE_PROPERTY_END_MAKE_ERROR(table, prop)
  }

#if 0 // TODO: bindTransforms & restTransforms check somewhere.
  // usdview and Houdini USD importer expects both `bindTransforms` and `restTransforms` are authored in USD
  if (!table.count("bindTransforms")) {
    // usdview and Houdini allow `bindTransforms` is not authord in USD, but it cannot compute skinning correctly without it,
    // so report an error in TinyUSDZ for a while.
    PUSH_ERROR_AND_RETURN_TAG(kTag, "`bindTransforms` is missing in Skeleton. Currently TinyUSDZ expects `bindTransforms` must exist in Skeleton.");
  }

  if (!table.count("restTransforms")) {
    // usdview and Houdini allow `restTransforms` is not authord in USD(usdview warns it), but it cannot compute skinning correctly without it,
    // (even SkelAnimation supplies trasnforms for all joints)
    // so report an error in TinyUSDZ for a while.
    PUSH_ERROR_AND_RETURN_TAG(kTag, "`restTransforms`(local joint matrices at rest state) is missing in Skeleton. Currently TinyUSDZ expects `restTransforms` must exist in Skeleton.");
  }

  // len(bindTransforms) must be equal to len(restTransforms)
  // TODO: Support connection
  {
    bool valid = false;
    if (auto bt = skel->bindTransforms.get_value()) {
      if (auto rt = skel->restTransforms.get_value()) {
        if (bt.value().size() == rt.value().size()) {
          // ok
          valid = true;
        }
      }
    }

    if (!valid) {
      PUSH_ERROR_AND_RETURN_TAG(kTag, "Array length must be same for `bindTransforms` and `restTransforms`.");
    }
  }
#endif

  return true;
}